

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

bool duckdb::UncompressedStringStorage::StringAnalyze
               (AnalyzeState *state_p,Vector *input,idx_t count)

{
  uint uVar1;
  BlockManager *pBVar2;
  idx_t iVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_78);
  state_p[1]._vptr_AnalyzeState = (_func_int **)((long)state_p[1]._vptr_AnalyzeState + count);
  if (count != 0) {
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)(local_78.sel)->sel_vector[uVar5];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6] >>
           (uVar6 & 0x3f) & 1) != 0)) {
        uVar1 = *(uint *)(local_78.data + uVar6 * 0x10);
        state_p[1].info.block_manager =
             (BlockManager *)
             ((long)&(state_p[1].info.block_manager)->_vptr_BlockManager + (ulong)uVar1);
        pBVar2 = (state_p->info).block_manager;
        iVar3 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
        iVar4 = optional_idx::GetIndex(&pBVar2->block_header_size);
        uVar6 = iVar3 - iVar4 >> 2 & 0xfffffffffffffff8;
        if (0xfff < uVar6) {
          uVar6 = 0x1000;
        }
        if ((uint)uVar6 <= uVar1) {
          state_p[2]._vptr_AnalyzeState = (_func_int **)((long)state_p[2]._vptr_AnalyzeState + 1);
        }
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool UncompressedStringStorage::StringAnalyze(AnalyzeState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<StringAnalyzeState>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	state.count += count;
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (vdata.validity.RowIsValid(idx)) {
			auto string_size = data[idx].GetSize();
			state.total_string_size += string_size;
			if (string_size >= StringUncompressed::GetStringBlockLimit(state.info.GetBlockSize())) {
				state.overflow_strings++;
			}
		}
	}
	return true;
}